

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86.cpp
# Opt level: O0

int __thiscall ncnn::ReLU_x86::forward_inplace(ReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 (*pauVar4) [16];
  float *pfVar5;
  float *pfVar6;
  Mat *in_RSI;
  long *in_RDI;
  int remain_1;
  float *ptr_3;
  int q_3;
  int remain;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p;
  int i;
  __m128 _zero;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  __m128 neg;
  __m128 pos;
  undefined8 in_stack_fffffffffffffc40;
  Mat *this_00;
  Mat *in_stack_fffffffffffffc48;
  int local_394;
  Mat local_390;
  float *local_348;
  int local_33c;
  float local_338;
  int local_334;
  Mat local_330;
  Option *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  int iVar7;
  ReLU_x86 *in_stack_fffffffffffffd28;
  int local_2c4;
  Mat local_2c0;
  Mat *local_278;
  int local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  int local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  Mat local_228;
  undefined1 (*local_1e0) [16];
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  Mat *local_1b0;
  int local_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  Mat *local_178;
  undefined1 (*local_170) [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  Mat *local_150;
  undefined1 local_148 [16];
  undefined1 (*local_130) [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_dc;
  void *local_d8;
  int *piStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  void *local_a8;
  int *piStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  void *local_68;
  int *piStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_1b0 = in_RSI;
  local_1bc = ncnn::Mat::elembits(in_RSI);
  if (local_1bc == 8) {
    local_19c = forward_inplace_int8
                          (in_stack_fffffffffffffd28,
                           (Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                           in_stack_fffffffffffffd18);
  }
  else {
    local_1c0 = local_1b0->w;
    local_1c4 = local_1b0->h;
    local_1c8 = local_1b0->d;
    local_1cc = local_1b0->c;
    local_1d0 = local_1c0 * local_1c4 * local_1c8;
    local_1d4 = local_1b0->elempack;
    if (local_1d4 == 4) {
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_1d4 = 4;
        for (local_26c = 0; local_26c < local_1cc; local_26c = local_26c + 1) {
          this_00 = &local_2c0;
          ncnn::Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)this_00 >> 0x20));
          in_stack_fffffffffffffc48 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
          ncnn::Mat::~Mat((Mat *)0x4ec4e2);
          local_278 = in_stack_fffffffffffffc48;
          for (local_2c4 = 0; local_2c4 < local_1d0; local_2c4 = local_2c4 + 1) {
            local_178 = local_278;
            local_d8 = local_278->data;
            piStack_d0 = local_278->refcount;
            auVar3._0_8_ = local_278->data;
            auVar3._8_8_ = local_278->refcount;
            auVar2._0_8_ = local_278->data;
            auVar2._8_8_ = local_278->refcount;
            local_150 = local_278;
            local_dc = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_78 = 0;
            uStack_70 = 0;
            local_98 = 0;
            uStack_90 = 0;
            local_f8 = maxps(ZEXT816(0),auVar2);
            local_88 = 0;
            uStack_80 = 0;
            local_58 = 0;
            uStack_50 = 0;
            local_108 = minps(ZEXT816(0),auVar3);
            local_18 = CONCAT44(local_dc,local_dc);
            uStack_10 = CONCAT44(local_dc,local_dc);
            local_28._0_4_ = local_108._0_4_;
            local_28._4_4_ = local_108._4_4_;
            uStack_20._0_4_ = local_108._8_4_;
            uStack_20._4_4_ = local_108._12_4_;
            local_48 = local_dc * (float)local_28;
            fStack_44 = local_dc * local_28._4_4_;
            fStack_40 = local_dc * (float)uStack_20;
            fStack_3c = local_dc * uStack_20._4_4_;
            local_38._0_4_ = local_f8._0_4_;
            local_38._4_4_ = local_f8._4_4_;
            fStack_30 = local_f8._8_4_;
            fStack_2c = local_f8._12_4_;
            local_168 = (float)local_38._0_4_ + local_48;
            fStack_164 = (float)local_38._4_4_ + fStack_44;
            fStack_160 = fStack_30 + fStack_40;
            fStack_15c = fStack_2c + fStack_3c;
            local_278->data = (void *)CONCAT44(fStack_164,local_168);
            local_278->refcount = (int *)CONCAT44(fStack_15c,fStack_160);
            local_278 = (Mat *)&local_278->elemsize;
            local_c8 = local_dc;
            fStack_c4 = local_dc;
            fStack_c0 = local_dc;
            fStack_bc = local_dc;
            local_b8 = local_dc;
            local_a8 = local_d8;
            piStack_a0 = piStack_d0;
            local_68 = local_d8;
            piStack_60 = piStack_d0;
            _local_38 = local_f8;
            local_28 = local_108._0_8_;
            uStack_20 = local_108._8_8_;
          }
        }
      }
      else {
        local_1d4 = 4;
        for (local_1d8 = 0; local_1d8 < local_1cc; local_1d8 = local_1d8 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffc48,
                             (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
          pauVar4 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_228);
          ncnn::Mat::~Mat((Mat *)0x4ec33b);
          local_188 = 0;
          local_198 = 0;
          uStack_194 = 0;
          uStack_190 = 0;
          uStack_18c = 0;
          local_248 = 0;
          uStack_240 = 0;
          local_1e0 = pauVar4;
          for (local_24c = 0; local_24c < local_1d0; local_24c = local_24c + 1) {
            local_170 = local_1e0;
            local_268 = *(undefined8 *)*local_1e0;
            uStack_260 = *(undefined8 *)(*local_1e0 + 8);
            local_130 = local_1e0;
            local_148 = maxps(ZEXT816(0),*local_1e0);
            *(undefined8 *)*local_1e0 = local_148._0_8_;
            *(undefined8 *)(*local_1e0 + 8) = local_148._8_8_;
            local_1e0 = local_1e0 + 1;
            local_128 = local_268;
            uStack_120 = uStack_260;
            local_118 = local_248;
            uStack_110 = uStack_240;
          }
        }
      }
      local_19c = 0;
    }
    else {
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        for (local_33c = 0; local_33c < local_1cc; local_33c = local_33c + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffc48,
                             (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
          pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_390);
          ncnn::Mat::~Mat((Mat *)0x4ec8a8);
          local_348 = pfVar5;
          for (local_394 = local_1d0; 0 < local_394; local_394 = local_394 + -1) {
            if (*local_348 <= 0.0 && *local_348 != 0.0) {
              *local_348 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * *local_348
              ;
            }
            local_348 = local_348 + 1;
          }
        }
      }
      else {
        for (iVar7 = 0; iVar7 < local_1cc; iVar7 = iVar7 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffc48,
                             (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
          pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_330);
          ncnn::Mat::~Mat((Mat *)0x4ec790);
          for (local_334 = local_1d0; 0 < local_334; local_334 = local_334 + -1) {
            local_338 = 0.0;
            pfVar6 = std::max<float>(pfVar5,&local_338);
            *pfVar5 = *pfVar6;
            pfVar5 = pfVar5 + 1;
          }
        }
      }
      local_19c = 0;
    }
  }
  return local_19c;
}

Assistant:

int ReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _zero = _mm256_set1_ps(0.f);
                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_max_ps(_zero, _p));
                    ptr += 8;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, lrelu_avx(_p, slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _zero = _mm_set1_ps(0.f);
                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_max_ps(_zero, _p));
                    ptr += 4;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, lrelu_sse(_p, slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *ptr = std::max(*ptr, 0.f);

                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                if (*ptr < 0)
                    *ptr *= slope;

                ptr++;
            }
        }
    }

    return 0;
}